

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O0

quad_value_bit_vector * bsim::quad_value_bit_vector_operations::lnot(quad_value_bit_vector *a)

{
  int iVar1;
  quad_value_bit_vector *in_RSI;
  quad_value_bit_vector *in_RDI;
  int i;
  quad_value_bit_vector *not_a;
  quad_value_bit_vector *in_stack_ffffffffffffffa8;
  quad_value val;
  int in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 local_18;
  
  quad_value_bit_vector::bitLength(in_RSI);
  quad_value_bit_vector::quad_value_bit_vector
            ((quad_value_bit_vector *)
             CONCAT17(in_stack_ffffffffffffffe7,
                      CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)),
             in_stack_ffffffffffffffdc);
  for (local_18 = 0; iVar1 = quad_value_bit_vector::bitLength(in_RSI), local_18 < iVar1;
      local_18 = local_18 + 1) {
    iVar1 = local_18;
    quad_value_bit_vector::get(in_stack_ffffffffffffffa8,0);
    val.value = (uchar)((uint)iVar1 >> 0x18);
    operator~((quad_value *)in_stack_ffffffffffffffa8);
    quad_value_bit_vector::set(in_stack_ffffffffffffffa8,0,val);
  }
  return in_RDI;
}

Assistant:

static inline quad_value_bit_vector lnot(const quad_value_bit_vector& a) {
      quad_value_bit_vector not_a(a.bitLength());
      for (int i = 0; i < a.bitLength(); i++) {
  	not_a.set(i, ~a.get(i));
      }
      return not_a;

    }